

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxs.cpp
# Opt level: O0

VOID PAL_Leave(PAL_Boundary boundary)

{
  CPalThread *this;
  CPalThread *pThread;
  PAL_Boundary boundary_local;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  this = CorUnix::InternalGetCurrentThread();
  CorUnix::CPalThread::Leave(this,boundary);
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  return;
}

Assistant:

VOID
PALAPI
PAL_Leave(PAL_Boundary boundary)
{
    ENTRY("PAL_Leave(boundary=%u)\n", boundary);

    CPalThread *pThread = InternalGetCurrentThread();
    // We ignore the return code.  This call should only fail on internal
    // error, and we assert at the actual failure.
    pThread->Leave(boundary);

    LOGEXIT("PAL_Leave returns\n");
}